

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseFirewall.cpp
# Opt level: O3

void tonk::Initialize(void)

{
  ostringstream *this;
  OutputWorker *this_00;
  undefined1 local_198 [392];
  
  if (DAT_001b8ab0 < 2) {
    this = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = ModuleLogger;
    local_198._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,DAT_001b8ae0,DAT_001b8ae8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Platform does not support firewall modifications",0x30);
    this_00 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  return;
}

Assistant:

void Firewall_Initialize()
{
    Initialize();
}